

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::InstanceIntersector1MB>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  float fVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  bool bVar26;
  bool bVar27;
  int iVar28;
  AABBNodeMB4D *node1;
  ulong uVar29;
  ulong unaff_RBP;
  ulong *puVar30;
  byte bVar31;
  InstancePrimitive *prim;
  long lVar32;
  byte bVar33;
  ulong uVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 in_ZMM7 [64];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  ulong local_2378;
  undefined4 local_2370;
  ulong local_2368 [1127];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  local_2370 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar51 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar7 = (context->query_radius).field_0;
    auVar50 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
    auVar51 = ZEXT1664(auVar50);
  }
  puVar30 = local_2368;
  fVar2 = (query->p).field_0.field_0.x;
  auVar48._4_4_ = fVar2;
  auVar48._0_4_ = fVar2;
  auVar48._8_4_ = fVar2;
  auVar48._12_4_ = fVar2;
  auVar48._16_4_ = fVar2;
  auVar48._20_4_ = fVar2;
  auVar48._24_4_ = fVar2;
  auVar48._28_4_ = fVar2;
  fVar3 = (query->p).field_0.field_0.y;
  auVar49._4_4_ = fVar3;
  auVar49._0_4_ = fVar3;
  auVar49._8_4_ = fVar3;
  auVar49._12_4_ = fVar3;
  auVar49._16_4_ = fVar3;
  auVar49._20_4_ = fVar3;
  auVar49._24_4_ = fVar3;
  auVar49._28_4_ = fVar3;
  fVar4 = (query->p).field_0.field_0.z;
  auVar52._4_4_ = fVar4;
  auVar52._0_4_ = fVar4;
  auVar52._8_4_ = fVar4;
  auVar52._12_4_ = fVar4;
  auVar52._16_4_ = fVar4;
  auVar52._20_4_ = fVar4;
  auVar52._24_4_ = fVar4;
  auVar52._28_4_ = fVar4;
  uVar5 = *(undefined4 *)&(context->query_radius).field_0;
  auVar43._4_4_ = uVar5;
  auVar43._0_4_ = uVar5;
  auVar43._8_4_ = uVar5;
  auVar43._12_4_ = uVar5;
  auVar43._16_4_ = uVar5;
  auVar43._20_4_ = uVar5;
  auVar43._24_4_ = uVar5;
  auVar43._28_4_ = uVar5;
  uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar45._4_4_ = uVar5;
  auVar45._0_4_ = uVar5;
  auVar45._8_4_ = uVar5;
  auVar45._12_4_ = uVar5;
  auVar45._16_4_ = uVar5;
  auVar45._20_4_ = uVar5;
  auVar45._24_4_ = uVar5;
  auVar45._28_4_ = uVar5;
  uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar35._4_4_ = uVar5;
  auVar35._0_4_ = uVar5;
  auVar35._8_4_ = uVar5;
  auVar35._12_4_ = uVar5;
  auVar35._16_4_ = uVar5;
  auVar35._20_4_ = uVar5;
  auVar35._24_4_ = uVar5;
  auVar35._28_4_ = uVar5;
  bVar27 = false;
  auVar12 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar53 = ZEXT3264(auVar12);
  auVar54 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  do {
    auVar12 = vsubps_avx(auVar48,auVar43);
    auVar8 = vsubps_avx(auVar49,auVar45);
    auVar9 = vsubps_avx(auVar52,auVar35);
    auVar46._0_4_ = fVar4 + auVar35._0_4_;
    auVar46._4_4_ = fVar4 + auVar35._4_4_;
    auVar46._8_4_ = fVar4 + auVar35._8_4_;
    auVar46._12_4_ = fVar4 + auVar35._12_4_;
    auVar46._16_4_ = fVar4 + auVar35._16_4_;
    auVar46._20_4_ = fVar4 + auVar35._20_4_;
    auVar46._24_4_ = fVar4 + auVar35._24_4_;
    auVar46._28_4_ = fVar4 + auVar35._28_4_;
    auVar35 = vmulps_avx512vl(auVar43,auVar43);
    auVar50 = auVar51._0_16_;
    do {
      do {
        do {
          if (puVar30 == &local_2378) {
            return bVar27;
          }
          pfVar1 = (float *)(puVar30 + -1);
          puVar30 = puVar30 + -2;
        } while (auVar51._0_4_ < *pfVar1);
        uVar34 = *puVar30;
        do {
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar34 & 8) == 0) {
              uVar29 = uVar34 & 0xfffffffffffffff0;
              fVar6 = query->time;
              auVar44._4_4_ = fVar6;
              auVar44._0_4_ = fVar6;
              auVar44._8_4_ = fVar6;
              auVar44._12_4_ = fVar6;
              auVar44._16_4_ = fVar6;
              auVar44._20_4_ = fVar6;
              auVar44._24_4_ = fVar6;
              auVar44._28_4_ = fVar6;
              auVar20 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar29 + 0x100),auVar44,
                                        *(undefined1 (*) [32])(uVar29 + 0x40));
              auVar21 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar29 + 0x140),auVar44,
                                        *(undefined1 (*) [32])(uVar29 + 0x80));
              auVar22 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar29 + 0x180),auVar44,
                                        *(undefined1 (*) [32])(uVar29 + 0xc0));
              auVar23 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar29 + 0x120),auVar44,
                                        *(undefined1 (*) [32])(uVar29 + 0x60));
              auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar29 + 0x160),auVar44,
                                        *(undefined1 (*) [32])(uVar29 + 0xa0));
              auVar25 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar29 + 0x1a0),auVar44,
                                        *(undefined1 (*) [32])(uVar29 + 0xe0));
              auVar38 = vmaxps_avx(auVar48,ZEXT1632(auVar20));
              auVar38 = vminps_avx(auVar38,ZEXT1632(auVar23));
              auVar10 = vsubps_avx(auVar38,auVar48);
              auVar38 = vmaxps_avx(auVar49,ZEXT1632(auVar21));
              auVar38 = vminps_avx(auVar38,ZEXT1632(auVar24));
              auVar36 = vsubps_avx(auVar38,auVar49);
              auVar38 = vmaxps_avx(auVar52,ZEXT1632(auVar22));
              auVar38 = vminps_avx(auVar38,ZEXT1632(auVar25));
              auVar38 = vsubps_avx(auVar38,auVar52);
              auVar41._0_4_ =
                   auVar10._0_4_ * auVar10._0_4_ + auVar36._0_4_ * auVar36._0_4_ +
                   auVar38._0_4_ * auVar38._0_4_;
              auVar41._4_4_ =
                   auVar10._4_4_ * auVar10._4_4_ + auVar36._4_4_ * auVar36._4_4_ +
                   auVar38._4_4_ * auVar38._4_4_;
              auVar41._8_4_ =
                   auVar10._8_4_ * auVar10._8_4_ + auVar36._8_4_ * auVar36._8_4_ +
                   auVar38._8_4_ * auVar38._8_4_;
              auVar41._12_4_ =
                   auVar10._12_4_ * auVar10._12_4_ + auVar36._12_4_ * auVar36._12_4_ +
                   auVar38._12_4_ * auVar38._12_4_;
              auVar41._16_4_ =
                   auVar10._16_4_ * auVar10._16_4_ + auVar36._16_4_ * auVar36._16_4_ +
                   auVar38._16_4_ * auVar38._16_4_;
              auVar41._20_4_ =
                   auVar10._20_4_ * auVar10._20_4_ + auVar36._20_4_ * auVar36._20_4_ +
                   auVar38._20_4_ * auVar38._20_4_;
              auVar41._24_4_ =
                   auVar10._24_4_ * auVar10._24_4_ + auVar36._24_4_ * auVar36._24_4_ +
                   auVar38._24_4_ * auVar38._24_4_;
              auVar41._28_4_ = auVar36._28_4_ + 0.0 + auVar38._28_4_;
              in_ZMM7 = ZEXT3264(auVar41);
              uVar13 = vcmpps_avx512vl(auVar41,auVar35,2);
              uVar14 = vcmpps_avx512vl(ZEXT1632(auVar20),ZEXT1632(auVar23),2);
              bVar33 = (byte)uVar13 & (byte)uVar14;
              if (((uint)uVar34 & 7) == 6) {
                uVar13 = vcmpps_avx512vl(auVar44,*(undefined1 (*) [32])(uVar29 + 0x1c0),0xd);
                uVar14 = vcmpps_avx512vl(auVar44,*(undefined1 (*) [32])(uVar29 + 0x1e0),1);
                bVar33 = (byte)uVar13 & (byte)uVar14 & bVar33;
              }
              unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),(uint)bVar33);
            }
          }
          else if ((uVar34 & 8) == 0) {
            uVar29 = uVar34 & 0xfffffffffffffff0;
            fVar6 = query->time;
            auVar37._4_4_ = fVar6;
            auVar37._0_4_ = fVar6;
            auVar37._8_4_ = fVar6;
            auVar37._12_4_ = fVar6;
            auVar37._16_4_ = fVar6;
            auVar37._20_4_ = fVar6;
            auVar37._24_4_ = fVar6;
            auVar37._28_4_ = fVar6;
            auVar20 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar29 + 0x100),auVar37,
                                      *(undefined1 (*) [32])(uVar29 + 0x40));
            auVar21 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar29 + 0x140),auVar37,
                                      *(undefined1 (*) [32])(uVar29 + 0x80));
            auVar22 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar29 + 0x180),auVar37,
                                      *(undefined1 (*) [32])(uVar29 + 0xc0));
            auVar23 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar29 + 0x120),auVar37,
                                      *(undefined1 (*) [32])(uVar29 + 0x60));
            auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar29 + 0x160),auVar37,
                                      *(undefined1 (*) [32])(uVar29 + 0xa0));
            auVar25 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar29 + 0x1a0),auVar37,
                                      *(undefined1 (*) [32])(uVar29 + 0xe0));
            auVar38 = vmaxps_avx(auVar48,ZEXT1632(auVar20));
            auVar38 = vminps_avx(auVar38,ZEXT1632(auVar23));
            auVar10 = vsubps_avx(auVar38,auVar48);
            auVar38 = vmaxps_avx(auVar49,ZEXT1632(auVar21));
            auVar38 = vminps_avx(auVar38,ZEXT1632(auVar24));
            auVar36 = vsubps_avx(auVar38,auVar49);
            auVar38 = vmaxps_avx(auVar52,ZEXT1632(auVar22));
            auVar38 = vminps_avx(auVar38,ZEXT1632(auVar25));
            auVar38 = vsubps_avx(auVar38,auVar52);
            in_ZMM7 = ZEXT3264(CONCAT428(auVar36._28_4_ + auVar36._28_4_ + auVar10._28_4_,
                                         CONCAT424(auVar38._24_4_ * auVar38._24_4_ +
                                                   auVar36._24_4_ * auVar36._24_4_ +
                                                   auVar10._24_4_ * auVar10._24_4_,
                                                   CONCAT420(auVar38._20_4_ * auVar38._20_4_ +
                                                             auVar36._20_4_ * auVar36._20_4_ +
                                                             auVar10._20_4_ * auVar10._20_4_,
                                                             CONCAT416(auVar38._16_4_ *
                                                                       auVar38._16_4_ +
                                                                       auVar36._16_4_ *
                                                                       auVar36._16_4_ +
                                                                       auVar10._16_4_ *
                                                                       auVar10._16_4_,
                                                                       CONCAT412(auVar38._12_4_ *
                                                                                 auVar38._12_4_ +
                                                                                 auVar36._12_4_ *
                                                                                 auVar36._12_4_ +
                                                                                 auVar10._12_4_ *
                                                                                 auVar10._12_4_,
                                                                                 CONCAT48(auVar38.
                                                  _8_4_ * auVar38._8_4_ +
                                                  auVar36._8_4_ * auVar36._8_4_ +
                                                  auVar10._8_4_ * auVar10._8_4_,
                                                  CONCAT44(auVar38._4_4_ * auVar38._4_4_ +
                                                           auVar36._4_4_ * auVar36._4_4_ +
                                                           auVar10._4_4_ * auVar10._4_4_,
                                                           auVar38._0_4_ * auVar38._0_4_ +
                                                           auVar36._0_4_ * auVar36._0_4_ +
                                                           auVar10._0_4_ * auVar10._0_4_))))))));
            uVar13 = vcmpps_avx512vl(ZEXT1632(auVar20),ZEXT1632(auVar23),2);
            uVar14 = vcmpps_avx512vl(ZEXT1632(auVar23),auVar12,1);
            auVar10._4_4_ = fVar2 + auVar43._4_4_;
            auVar10._0_4_ = fVar2 + auVar43._0_4_;
            auVar10._8_4_ = fVar2 + auVar43._8_4_;
            auVar10._12_4_ = fVar2 + auVar43._12_4_;
            auVar10._16_4_ = fVar2 + auVar43._16_4_;
            auVar10._20_4_ = fVar2 + auVar43._20_4_;
            auVar10._24_4_ = fVar2 + auVar43._24_4_;
            auVar10._28_4_ = fVar2 + auVar43._28_4_;
            uVar15 = vcmpps_avx512vl(ZEXT1632(auVar20),auVar10,6);
            uVar16 = vcmpps_avx512vl(ZEXT1632(auVar24),auVar8,1);
            auVar38._4_4_ = fVar3 + auVar45._4_4_;
            auVar38._0_4_ = fVar3 + auVar45._0_4_;
            auVar38._8_4_ = fVar3 + auVar45._8_4_;
            auVar38._12_4_ = fVar3 + auVar45._12_4_;
            auVar38._16_4_ = fVar3 + auVar45._16_4_;
            auVar38._20_4_ = fVar3 + auVar45._20_4_;
            auVar38._24_4_ = fVar3 + auVar45._24_4_;
            auVar38._28_4_ = fVar3 + auVar45._28_4_;
            uVar17 = vcmpps_avx512vl(ZEXT1632(auVar21),auVar38,6);
            uVar18 = vcmpps_avx512vl(ZEXT1632(auVar25),auVar9,1);
            uVar19 = vcmpps_avx512vl(ZEXT1632(auVar22),auVar46,6);
            bVar33 = ~((byte)uVar17 | (byte)uVar15 | (byte)uVar19 | (byte)uVar14 |
                      (byte)uVar16 | (byte)uVar18) & (byte)uVar13;
            unaff_RBP = (ulong)bVar33;
            if (((uint)uVar34 & 7) == 6) {
              uVar13 = vcmpps_avx512vl(auVar37,*(undefined1 (*) [32])(uVar29 + 0x1e0),1);
              uVar14 = vcmpps_avx512vl(auVar37,*(undefined1 (*) [32])(uVar29 + 0x1c0),0xd);
              unaff_RBP = (ulong)((byte)uVar13 & (byte)uVar14 & bVar33);
            }
          }
          if ((uVar34 & 8) == 0) {
            if (unaff_RBP == 0) {
              iVar28 = 4;
            }
            else {
              auVar38 = *(undefined1 (*) [32])(uVar34 & 0xfffffffffffffff0);
              auVar10 = ((undefined1 (*) [32])(uVar34 & 0xfffffffffffffff0))[1];
              auVar44 = in_ZMM7._0_32_;
              auVar36 = vpternlogd_avx512vl(auVar53._0_32_,auVar44,auVar54._0_32_,0xf8);
              uVar34 = unaff_RBP & 0xffffffff;
              auVar37 = vpcompressd_avx512vl(auVar36);
              bVar26 = (bool)((byte)uVar34 & 1);
              auVar40._0_4_ = (uint)bVar26 * auVar37._0_4_ | (uint)!bVar26 * auVar36._0_4_;
              bVar26 = (bool)((byte)(uVar34 >> 1) & 1);
              auVar40._4_4_ = (uint)bVar26 * auVar37._4_4_ | (uint)!bVar26 * auVar36._4_4_;
              bVar26 = (bool)((byte)(uVar34 >> 2) & 1);
              auVar40._8_4_ = (uint)bVar26 * auVar37._8_4_ | (uint)!bVar26 * auVar36._8_4_;
              bVar26 = (bool)((byte)(uVar34 >> 3) & 1);
              auVar40._12_4_ = (uint)bVar26 * auVar37._12_4_ | (uint)!bVar26 * auVar36._12_4_;
              bVar26 = (bool)((byte)(uVar34 >> 4) & 1);
              auVar40._16_4_ = (uint)bVar26 * auVar37._16_4_ | (uint)!bVar26 * auVar36._16_4_;
              bVar26 = (bool)((byte)(uVar34 >> 5) & 1);
              auVar40._20_4_ = (uint)bVar26 * auVar37._20_4_ | (uint)!bVar26 * auVar36._20_4_;
              bVar26 = (bool)((byte)(uVar34 >> 6) & 1);
              auVar40._24_4_ = (uint)bVar26 * auVar37._24_4_ | (uint)!bVar26 * auVar36._24_4_;
              bVar26 = (bool)((byte)(uVar34 >> 7) & 1);
              auVar40._28_4_ = (uint)bVar26 * auVar37._28_4_ | (uint)!bVar26 * auVar36._28_4_;
              auVar36 = vpermt2q_avx512vl(auVar38,auVar40,auVar10);
              uVar34 = auVar36._0_8_;
              iVar28 = 0;
              uVar29 = unaff_RBP - 1 & unaff_RBP;
              if (uVar29 != 0) {
                auVar36 = vpshufd_avx2(auVar40,0x55);
                vpermt2q_avx512vl(auVar38,auVar36,auVar10);
                auVar37 = vpminsd_avx2(auVar40,auVar36);
                auVar36 = vpmaxsd_avx2(auVar40,auVar36);
                uVar29 = uVar29 - 1 & uVar29;
                if (uVar29 == 0) {
                  auVar37 = vpermi2q_avx512vl(auVar37,auVar38,auVar10);
                  uVar34 = auVar37._0_8_;
                  auVar38 = vpermt2q_avx512vl(auVar38,auVar36,auVar10);
                  *puVar30 = auVar38._0_8_;
                  auVar38 = vpermd_avx2(auVar36,auVar44);
                  *(int *)(puVar30 + 1) = auVar38._0_4_;
                  puVar30 = puVar30 + 2;
                }
                else {
                  auVar42 = vpshufd_avx2(auVar40,0xaa);
                  vpermt2q_avx512vl(auVar38,auVar42,auVar10);
                  auVar41 = vpminsd_avx2(auVar37,auVar42);
                  auVar37 = vpmaxsd_avx2(auVar37,auVar42);
                  auVar42 = vpminsd_avx2(auVar36,auVar37);
                  auVar36 = vpmaxsd_avx2(auVar36,auVar37);
                  uVar29 = uVar29 - 1 & uVar29;
                  if (uVar29 == 0) {
                    auVar37 = vpermi2q_avx512vl(auVar41,auVar38,auVar10);
                    uVar34 = auVar37._0_8_;
                    auVar37 = vpermt2q_avx512vl(auVar38,auVar36,auVar10);
                    *puVar30 = auVar37._0_8_;
                    auVar36 = vpermd_avx2(auVar36,auVar44);
                    *(int *)(puVar30 + 1) = auVar36._0_4_;
                    auVar38 = vpermt2q_avx512vl(auVar38,auVar42,auVar10);
                    puVar30[2] = auVar38._0_8_;
                    auVar38 = vpermd_avx2(auVar42,auVar44);
                    *(int *)(puVar30 + 3) = auVar38._0_4_;
                    puVar30 = puVar30 + 4;
                  }
                  else {
                    auVar37 = vpshufd_avx2(auVar40,0xff);
                    vpermt2q_avx512vl(auVar38,auVar37,auVar10);
                    auVar11 = vpminsd_avx2(auVar41,auVar37);
                    auVar37 = vpmaxsd_avx2(auVar41,auVar37);
                    auVar41 = vpminsd_avx2(auVar42,auVar37);
                    auVar37 = vpmaxsd_avx2(auVar42,auVar37);
                    auVar42 = vpminsd_avx2(auVar36,auVar37);
                    auVar36 = vpmaxsd_avx2(auVar36,auVar37);
                    uVar29 = uVar29 - 1 & uVar29;
                    iVar28 = 0;
                    if (uVar29 == 0) {
                      auVar37 = vpermi2q_avx512vl(auVar11,auVar38,auVar10);
                      uVar34 = auVar37._0_8_;
                      auVar37 = vpermt2q_avx512vl(auVar38,auVar36,auVar10);
                      *puVar30 = auVar37._0_8_;
                      in_ZMM7 = ZEXT3264(auVar44);
                      auVar36 = vpermd_avx2(auVar36,auVar44);
                      *(int *)(puVar30 + 1) = auVar36._0_4_;
                      auVar36 = vpermt2q_avx512vl(auVar38,auVar42,auVar10);
                      puVar30[2] = auVar36._0_8_;
                      auVar36 = vpermd_avx2(auVar42,auVar44);
                      *(int *)(puVar30 + 3) = auVar36._0_4_;
                      auVar38 = vpermt2q_avx512vl(auVar38,auVar41,auVar10);
                      puVar30[4] = auVar38._0_8_;
                      auVar38 = vpermd_avx2(auVar41,auVar44);
                      *(int *)(puVar30 + 5) = auVar38._0_4_;
                      puVar30 = puVar30 + 6;
                    }
                    else {
                      auVar39 = valignd_avx512vl(auVar40,auVar40,3);
                      auVar37 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                      auVar40 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                     CONCAT48(0x80000000,
                                                                              0x8000000080000000))),
                                                  auVar37,auVar11);
                      auVar37 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                      auVar41 = vpermt2d_avx512vl(auVar40,auVar37,auVar41);
                      auVar41 = vpermt2d_avx512vl(auVar41,auVar37,auVar42);
                      auVar37 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                      auVar36 = vpermt2d_avx512vl(auVar41,auVar37,auVar36);
                      auVar47 = ZEXT3264(auVar36);
                      uVar34 = uVar29;
                      do {
                        auVar37 = auVar47._0_32_;
                        auVar36._8_4_ = 1;
                        auVar36._0_8_ = 0x100000001;
                        auVar36._12_4_ = 1;
                        auVar36._16_4_ = 1;
                        auVar36._20_4_ = 1;
                        auVar36._24_4_ = 1;
                        auVar36._28_4_ = 1;
                        auVar36 = vpermd_avx2(auVar36,auVar39);
                        auVar39 = valignd_avx512vl(auVar39,auVar39,1);
                        vpermt2q_avx512vl(auVar38,auVar39,auVar10);
                        uVar34 = uVar34 - 1 & uVar34;
                        uVar13 = vpcmpd_avx512vl(auVar36,auVar37,5);
                        auVar36 = vpmaxsd_avx2(auVar36,auVar37);
                        bVar33 = (byte)uVar13 << 1;
                        auVar37 = valignd_avx512vl(auVar37,auVar37,7);
                        bVar26 = (bool)((byte)uVar13 & 1);
                        auVar42._4_4_ = (uint)bVar26 * auVar37._4_4_ | (uint)!bVar26 * auVar36._4_4_
                        ;
                        auVar42._0_4_ = auVar36._0_4_;
                        bVar26 = (bool)(bVar33 >> 2 & 1);
                        auVar42._8_4_ = (uint)bVar26 * auVar37._8_4_ | (uint)!bVar26 * auVar36._8_4_
                        ;
                        bVar26 = (bool)(bVar33 >> 3 & 1);
                        auVar42._12_4_ =
                             (uint)bVar26 * auVar37._12_4_ | (uint)!bVar26 * auVar36._12_4_;
                        bVar26 = (bool)(bVar33 >> 4 & 1);
                        auVar42._16_4_ =
                             (uint)bVar26 * auVar37._16_4_ | (uint)!bVar26 * auVar36._16_4_;
                        bVar26 = (bool)(bVar33 >> 5 & 1);
                        auVar42._20_4_ =
                             (uint)bVar26 * auVar37._20_4_ | (uint)!bVar26 * auVar36._20_4_;
                        bVar26 = (bool)(bVar33 >> 6 & 1);
                        auVar42._24_4_ =
                             (uint)bVar26 * auVar37._24_4_ | (uint)!bVar26 * auVar36._24_4_;
                        auVar42._28_4_ =
                             (uint)(bVar33 >> 7) * auVar37._28_4_ |
                             (uint)!(bool)(bVar33 >> 7) * auVar36._28_4_;
                        auVar47 = ZEXT3264(auVar42);
                      } while (uVar34 != 0);
                      lVar32 = POPCOUNT(uVar29) + 3;
                      do {
                        auVar36 = vpermi2q_avx512vl(auVar42,auVar38,auVar10);
                        *puVar30 = auVar36._0_8_;
                        auVar37 = auVar47._0_32_;
                        auVar36 = vpermd_avx2(auVar37,auVar44);
                        *(int *)(puVar30 + 1) = auVar36._0_4_;
                        auVar42 = valignd_avx512vl(auVar37,auVar37,1);
                        puVar30 = puVar30 + 2;
                        auVar47 = ZEXT3264(auVar42);
                        lVar32 = lVar32 + -1;
                      } while (lVar32 != 0);
                      auVar38 = vpermt2q_avx512vl(auVar38,auVar42,auVar10);
                      uVar34 = auVar38._0_8_;
                      in_ZMM7 = ZEXT3264(auVar44);
                    }
                  }
                }
              }
            }
          }
          else {
            iVar28 = 6;
          }
        } while (iVar28 == 0);
      } while ((iVar28 != 6) || (lVar32 = (ulong)((uint)uVar34 & 0xf) - 8, lVar32 == 0));
      prim = (InstancePrimitive *)(uVar34 & 0xfffffffffffffff0);
      bVar33 = 0;
      do {
        bVar31 = bVar33;
        bVar26 = InstanceIntersector1MB::pointQuery(query,context,prim);
        prim = prim + 1;
        lVar32 = lVar32 + -1;
        bVar33 = bVar31 | bVar26;
      } while (lVar32 != 0);
      auVar51 = ZEXT1664(auVar50);
      auVar38 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar53 = ZEXT3264(auVar38);
      auVar54 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
      in_ZMM7 = ZEXT3264(in_ZMM7._0_32_);
    } while (bVar31 == 0 && !bVar26);
    uVar5 = *(undefined4 *)&(context->query_radius).field_0;
    auVar43._4_4_ = uVar5;
    auVar43._0_4_ = uVar5;
    auVar43._8_4_ = uVar5;
    auVar43._12_4_ = uVar5;
    auVar43._16_4_ = uVar5;
    auVar43._20_4_ = uVar5;
    auVar43._24_4_ = uVar5;
    auVar43._28_4_ = uVar5;
    uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar45._4_4_ = uVar5;
    auVar45._0_4_ = uVar5;
    auVar45._8_4_ = uVar5;
    auVar45._12_4_ = uVar5;
    auVar45._16_4_ = uVar5;
    auVar45._20_4_ = uVar5;
    auVar45._24_4_ = uVar5;
    auVar45._28_4_ = uVar5;
    uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar35._4_4_ = uVar5;
    auVar35._0_4_ = uVar5;
    auVar35._8_4_ = uVar5;
    auVar35._12_4_ = uVar5;
    auVar35._16_4_ = uVar5;
    auVar35._20_4_ = uVar5;
    auVar35._24_4_ = uVar5;
    auVar35._28_4_ = uVar5;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar51 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar7 = (context->query_radius).field_0;
      auVar50 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
      auVar51 = ZEXT1664(auVar50);
    }
    bVar27 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }